

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_client_write(connectdata *conn,int type,char *ptr,size_t len)

{
  char *pcVar1;
  curl_off_t *pcVar2;
  SessionHandle *pSVar3;
  CURLcode CVar4;
  short *psVar5;
  short *psVar6;
  
  pSVar3 = conn->data;
  if (len == 0) {
    len = strlen(ptr);
  }
  if (((((type & 1U) != 0) && ((conn->handler->protocol & 0xc) != 0)) &&
      ((conn->proto).ftpc.transfertype == 'A')) && (len != 0 && ptr != (char *)0x0)) {
    if ((pSVar3->state).prev_block_had_trailing_cr == true) {
      if (*ptr == '\n') {
        len = len - 1;
        memmove(ptr,ptr + 1,len);
        pcVar2 = &(pSVar3->state).crlf_conversions;
        *pcVar2 = *pcVar2 + 1;
      }
      (pSVar3->state).prev_block_had_trailing_cr = false;
    }
    psVar5 = (short *)memchr(ptr,0xd,len);
    if (psVar5 != (short *)0x0) {
      for (psVar6 = psVar5; psVar6 < ptr + (len - 1); psVar6 = (short *)((long)psVar6 + 1)) {
        if (*psVar6 == 0xa0d) {
          pcVar1 = (char *)((long)psVar6 + 1);
          psVar6 = (short *)((long)psVar6 + 1);
          *(char *)psVar5 = *pcVar1;
          pcVar2 = &(pSVar3->state).crlf_conversions;
          *pcVar2 = *pcVar2 + 1;
        }
        else if ((char)*psVar6 == '\r') {
          *(char *)psVar5 = '\n';
        }
        else {
          *(char *)psVar5 = (char)*psVar6;
        }
        psVar5 = (short *)((long)psVar5 + 1);
      }
      if (psVar6 < ptr + len) {
        if ((char)*psVar6 == '\r') {
          *(char *)psVar5 = '\n';
          (pSVar3->state).prev_block_had_trailing_cr = true;
        }
        else {
          *(char *)psVar5 = (char)*psVar6;
        }
        psVar5 = (short *)((long)psVar5 + 1);
      }
      if (psVar5 < ptr + len) {
        *(char *)psVar5 = '\0';
      }
      len = (long)psVar5 - (long)ptr;
    }
  }
  CVar4 = Curl_client_chop_write(conn,type,ptr,len);
  return CVar4;
}

Assistant:

CURLcode Curl_client_write(struct connectdata *conn,
                           int type,
                           char *ptr,
                           size_t len)
{
  struct SessionHandle *data = conn->data;

  if(0 == len)
    len = strlen(ptr);

  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
    (conn->handler->protocol & PROTO_FAMILY_FTP) &&
    conn->proto.ftpc.transfertype == 'A') {
    /* convert from the network encoding */
    CURLcode result = Curl_convert_from_network(data, ptr, len);
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

#ifdef CURL_DO_LINEEND_CONV
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
#endif /* CURL_DO_LINEEND_CONV */
    }

  return Curl_client_chop_write(conn, type, ptr, len);
}